

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_leader(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *string;
  CHAR_DATA *pCVar2;
  CHAR_DATA *in_RDI;
  int cres;
  CHAR_DATA *unaff_retaddr;
  CHAR_DATA *victim;
  char buf [4608];
  char arg1 [4608];
  uint in_stack_ffffffffffffdbd8;
  undefined4 uVar3;
  char *in_stack_ffffffffffffdbe0;
  CHAR_DATA *in_stack_ffffffffffffdbe8;
  char *in_stack_ffffffffffffdbf0;
  CHAR_DATA *in_stack_ffffffffffffdc50;
  char local_1218;
  char *in_stack_ffffffffffffffe0;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  
  uVar3 = 0;
  if ((in_RDI->level < 0x36) ||
     (bVar1 = is_npc((CHAR_DATA *)(ulong)in_stack_ffffffffffffdbd8), bVar1)) {
    send_to_char(in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
    return;
  }
  string = one_argument(in_stack_ffffffffffffdbe0,(char *)CONCAT44(uVar3,in_stack_ffffffffffffdbd8))
  ;
  if (local_1218 == '\0') {
    send_to_char(in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
    return;
  }
  pCVar2 = get_char_world(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  if (pCVar2 == (CHAR_DATA *)0x0) {
    send_to_char(in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
    return;
  }
  bVar1 = is_npc((CHAR_DATA *)CONCAT44(uVar3,in_stack_ffffffffffffdbd8));
  if (bVar1) {
    send_to_char(in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
    return;
  }
  if (pCVar2->pcdata->induct == 5) {
    send_to_char(in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
    sprintf(&stack0xffffffffffffdbe8,"You have taken away %s\'s power to induct.\n\r",pCVar2->name);
    send_to_char(in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
    pCVar2->pcdata->induct = 0;
    sprintf(&stack0xffffffffffffdbe8,"AUTO: %s removed leadership.\n\r",in_RDI->true_name);
    add_history(unaff_retaddr,in_RDI,string);
    return;
  }
  send_to_char(in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
  sprintf(&stack0xffffffffffffdbe8,"You have given %s the power to induct.\n\r",pCVar2->name);
  send_to_char(in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
  pCVar2->pcdata->induct = 5;
  update_cskills(in_stack_ffffffffffffdc50);
  sprintf(&stack0xffffffffffffdbe8,"AUTO: %s gave leadership.\n\r",in_RDI->true_name);
  add_history(unaff_retaddr,in_RDI,string);
  return;
}

Assistant:

void do_leader(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char buf[MAX_STRING_LENGTH];
	CHAR_DATA *victim;
	int cres = 0;

	if (ch->level < 54 || is_npc(ch))
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	argument = one_argument(argument, arg1);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax: leader <char>\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("They aren't playing.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("Can't make mobs leaders.\n\r", ch);
		return;
	}

	if (victim->pcdata->induct == CABAL_LEADER)
	{
		send_to_char("Your power to induct has been taken away!\n\r", victim);

		sprintf(buf, "You have taken away %s's power to induct.\n\r", victim->name);
		send_to_char(buf, ch);

		victim->pcdata->induct = 0;

		sprintf(buf, "AUTO: %s removed leadership.\n\r", ch->true_name);
		add_history(nullptr, victim, buf);
		return;
	}
	else
	{
		send_to_char("You have been given the power to induct!\n\r", victim);

		sprintf(buf, "You have given %s the power to induct.\n\r", victim->name);
		send_to_char(buf, ch);

		victim->pcdata->induct = CABAL_LEADER;
		update_cskills(victim);

		sprintf(buf, "AUTO: %s gave leadership.\n\r", ch->true_name);
		add_history(nullptr, victim, buf);
		return;
	}

	RS.SQL.Update("players SET induct=%d WHERE name = '%s'", ch->pcdata->induct, ch->true_name);
}